

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void set_ma_use_armci_mem_(void)

{
  int iVar1;
  
  iVar1 = setenv("MA_USE_ARMCI_MEM","YES",1);
  if (iVar1 != 0) {
    GA_Error("setenv failed: insufficient space in the environment",1);
    return;
  }
  return;
}

Assistant:

void FATR set_ma_use_armci_mem_() 
{
    int retval;
#if defined(_WIN32)
    if((retval=_putenv("MA_USE_ARMCI_MEM=YES")) != 0)
#else
    if((retval=setenv("MA_USE_ARMCI_MEM", "YES", 1)) != 0)
#endif          
    GA_Error("setenv failed: insufficient space in the environment",1);
}